

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::fixVariableInterfaces(Model *this)

{
  ulong uVar1;
  bool bVar2;
  InterfaceType interfaceType_00;
  size_t sVar3;
  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  InterfaceType interfaceType;
  shared_ptr<libcellml::Variable> *variable;
  iterator __end1;
  iterator __begin1;
  VariablePtrs *__range1;
  undefined1 local_50 [7];
  bool allOk;
  ulong local_30;
  size_t index;
  VariablePtrs variables;
  Model *this_local;
  
  variables.
  super__Vector_base<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
  ::vector((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
            *)&index);
  for (local_30 = 0; uVar1 = local_30,
      sVar3 = ComponentEntity::componentCount(&this->super_ComponentEntity), uVar1 < sVar3;
      local_30 = local_30 + 1) {
    ComponentEntity::component((ComponentEntity *)local_50,(size_t)this);
    findAllVariablesWithEquivalences((ComponentPtr *)local_50,(VariablePtrs *)&index);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_50)
    ;
  }
  __range1._7_1_ = true;
  __end1 = std::
           vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
           ::begin((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
                    *)&index);
  variable = (shared_ptr<libcellml::Variable> *)
             std::
             vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
             ::end((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
                    *)&index);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
                                     *)&variable), bVar2) {
    this_00 = (__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
              ::operator*(&__end1);
    interfaceType_00 = determineInterfaceType((VariablePtr *)this_00);
    if (interfaceType_00 == NONE) {
      __range1._7_1_ = false;
    }
    else {
      peVar4 = std::
               __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      bVar2 = Variable::permitsInterfaceType(peVar4,interfaceType_00);
      if (!bVar2) {
        peVar4 = std::
                 __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_00);
        Variable::setInterfaceType(peVar4,interfaceType_00);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Variable>_*,_std::vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
  ::~vector((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
             *)&index);
  return __range1._7_1_;
}

Assistant:

bool Model::fixVariableInterfaces()
{
    VariablePtrs variables;

    for (size_t index = 0; index < componentCount(); ++index) {
        findAllVariablesWithEquivalences(component(index), variables);
    }

    bool allOk = true;
    for (const auto &variable : variables) {
        Variable::InterfaceType interfaceType = determineInterfaceType(variable);
        if (interfaceType == Variable::InterfaceType::NONE) {
            allOk = false;
        } else if (!variable->permitsInterfaceType(interfaceType)) {
            variable->setInterfaceType(interfaceType);
        }
    }

    return allOk;
}